

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_29792f8::ConvolveScaleTestBase<unsigned_char>::~ConvolveScaleTestBase
          (ConvolveScaleTestBase<unsigned_char> *this)

{
  TestImage<unsigned_char> *pTVar1;
  pointer puVar2;
  pointer puVar3;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ConvolveScaleTestBase_0107cd90;
  pTVar1 = this->image_;
  if (pTVar1 != (TestImage<unsigned_char> *)0x0) {
    puVar2 = (pTVar1->dst_16_data_).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2);
    }
    puVar3 = (pTVar1->dst_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (puVar3 != (pointer)0x0) {
      operator_delete(puVar3);
    }
    puVar3 = (pTVar1->src_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (puVar3 != (pointer)0x0) {
      operator_delete(puVar3);
    }
  }
  operator_delete(pTVar1);
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)this);
  return;
}

Assistant:

~ConvolveScaleTestBase() override { delete image_; }